

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * GetTextureData(Texture2D texture)

{
  int logType;
  void *pvVar1;
  char *text;
  Image *in_RDI;
  
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  if (texture.format < 0xb) {
    pvVar1 = rlReadTexturePixels(texture);
    in_RDI->data = pvVar1;
    if (pvVar1 != (void *)0x0) {
      in_RDI->width = (int)texture._4_8_;
      in_RDI->height = (int)((ulong)texture._4_8_ >> 0x20);
      in_RDI->format = texture.format;
      in_RDI->mipmaps = 1;
      text = "TEXTURE: [ID %i] Pixel data retrieved successfully";
      logType = 3;
      goto LAB_00139aef;
    }
    text = "TEXTURE: [ID %i] Failed to retrieve pixel data";
  }
  else {
    text = "TEXTURE: [ID %i] Failed to retrieve compressed pixel data";
  }
  logType = 4;
LAB_00139aef:
  TraceLog(logType,text,(ulong)texture.id);
  return in_RDI;
}

Assistant:

Image GetTextureData(Texture2D texture)
{
    Image image = { 0 };

    if (texture.format < PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        image.data = rlReadTexturePixels(texture);

        if (image.data != NULL)
        {
            image.width = texture.width;
            image.height = texture.height;
            image.format = texture.format;
            image.mipmaps = 1;

#if defined(GRAPHICS_API_OPENGL_ES2)
            // NOTE: Data retrieved on OpenGL ES 2.0 should be RGBA,
            // coming from FBO color buffer attachment, but it seems
            // original texture format is retrieved on RPI...
            image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
#endif
            TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Pixel data retrieved successfully", texture.id);
        }
        else TRACELOG(LOG_WARNING, "TEXTURE: [ID %i] Failed to retrieve pixel data", texture.id);
    }
    else TRACELOG(LOG_WARNING, "TEXTURE: [ID %i] Failed to retrieve compressed pixel data", texture.id);

    return image;
}